

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int get_mvpred_var_cost(FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV *this_mv,
                       FULLPEL_MV_STATS *mv_stats)

{
  aom_variance_fn_ptr_t *paVar1;
  buf_2d *pbVar2;
  buf_2d *pbVar3;
  uint uVar4;
  int iVar5;
  MV sub_this_mv;
  
  paVar1 = ms_params->vfp;
  get_mv_from_fullmv(this_mv);
  pbVar2 = (ms_params->ms_buffers).ref;
  pbVar3 = (ms_params->ms_buffers).src;
  iVar5 = pbVar2->stride;
  uVar4 = (*paVar1->vf)(pbVar3->buf,pbVar3->stride,
                        pbVar2->buf + (long)this_mv->col + (long)this_mv->row * (long)iVar5,iVar5,
                        &mv_stats->sse);
  mv_stats->distortion = uVar4;
  iVar5 = mv_err_cost_((MV *)&stack0xffffffffffffffcc,&ms_params->mv_cost_params);
  mv_stats->err_cost = iVar5;
  return iVar5 + uVar4;
}

Assistant:

static inline int get_mvpred_var_cost(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, const FULLPEL_MV *this_mv,
    FULLPEL_MV_STATS *mv_stats) {
  const aom_variance_fn_ptr_t *vfp = ms_params->vfp;
  const MV sub_this_mv = get_mv_from_fullmv(this_mv);
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  const int ref_stride = ref->stride;

  int bestsme;

  bestsme = vfp->vf(src_buf, src_stride, get_buf_from_fullmv(ref, this_mv),
                    ref_stride, &mv_stats->sse);
  mv_stats->distortion = bestsme;

  mv_stats->err_cost = mv_err_cost_(&sub_this_mv, &ms_params->mv_cost_params);
  bestsme += mv_stats->err_cost;

  return bestsme;
}